

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreBroker.cpp
# Opt level: O0

string * __thiscall
helics::CoreBroker::generateQueryAnswer_abi_cxx11_
          (CoreBroker *this,string_view request,bool force_ordering)

{
  initializer_list_t init;
  initializer_list_t init_00;
  initializer_list_t init_01;
  initializer_list_t init_02;
  initializer_list_t init_03;
  initializer_list_t init_04;
  initializer_list_t init_05;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_00;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_01;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_02;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_03;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_04;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_05;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_06;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_07;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_08;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_09;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_10;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_11;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_12;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_13;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_14;
  basic_string_view<char,_std::char_traits<char>_> __x;
  basic_string_view<char,_std::char_traits<char>_> __x_00;
  basic_string_view<char,_std::char_traits<char>_> __x_01;
  basic_string_view<char,_std::char_traits<char>_> __x_02;
  basic_string_view<char,_std::char_traits<char>_> __x_03;
  basic_string_view<char,_std::char_traits<char>_> __x_04;
  basic_string_view<char,_std::char_traits<char>_> __x_05;
  basic_string_view<char,_std::char_traits<char>_> __x_06;
  basic_string_view<char,_std::char_traits<char>_> __x_07;
  basic_string_view<char,_std::char_traits<char>_> __x_08;
  basic_string_view<char,_std::char_traits<char>_> __x_09;
  basic_string_view<char,_std::char_traits<char>_> __x_10;
  basic_string_view<char,_std::char_traits<char>_> __x_11;
  basic_string_view<char,_std::char_traits<char>_> __x_12;
  basic_string_view<char,_std::char_traits<char>_> __x_13;
  basic_string_view<char,_std::char_traits<char>_> __x_14;
  string_view name;
  format_args args;
  string_view fmt;
  string_view request_00;
  string_view request_01;
  bool bVar1;
  int iVar2;
  int iVar3;
  size_type sVar4;
  atomic<int> *paVar5;
  element_type *this_00;
  pointer pBVar6;
  pointer ppVar7;
  __tuple_element_t<0UL,_tuple<JsonMapBuilder,_vector<ActionMessage,_allocator<ActionMessage>_>,_QueryReuse>_>
  *this_01;
  reference this_02;
  void *in_RCX;
  undefined8 in_RDX;
  CoreBroker *in_RSI;
  string *in_RDI;
  byte in_R8B;
  GlobalFederateId *dep_1;
  iterator __end2_3;
  iterator __begin2_3;
  vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_> *__range2_3;
  GlobalFederateId *dep;
  iterator __end2_2;
  iterator __begin2_2;
  vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_> *__range2_2;
  json base_4;
  string interfaceQueryResult;
  int center_1;
  int center;
  __tuple_element_t<0UL,_tuple<JsonMapBuilder,_vector<ActionMessage,_allocator<ActionMessage>_>,_QueryReuse>_>
  *builder;
  unsigned_short index;
  const_iterator mapping;
  json json;
  json brkstate;
  BasicBrokerInfo *brk;
  const_iterator __end2_1;
  const_iterator __begin2_1;
  DualStringMappedVector<helics::BasicBrokerInfo,_helics::GlobalBrokerId,_(reference_stability)1,_5>
  *__range2_1;
  json fedstate;
  BasicFedInfo *fed;
  const_iterator __end2;
  const_iterator __begin2;
  DualStringMappedVector<helics::BasicFedInfo,_helics::GlobalFederateId,_(reference_stability)1,_5>
  *__range2;
  json base_3;
  json base_2;
  json base_1;
  json base;
  string res;
  anon_class_8_1_8991fb9c addHeader;
  memory_order __b;
  DualStringMappedVector<helics::BasicBrokerInfo,_helics::GlobalBrokerId,_(reference_stability)1,_5>
  *in_stack_fffffffffffff348;
  CoreBroker *in_stack_fffffffffffff350;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff358;
  undefined4 in_stack_fffffffffffff360;
  BaseType in_stack_fffffffffffff364;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff368;
  CoreBroker *in_stack_fffffffffffff370;
  JsonMapBuilder *in_stack_fffffffffffff378;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffff380;
  undefined4 in_stack_fffffffffffff388;
  undefined4 in_stack_fffffffffffff38c;
  CoreBroker *in_stack_fffffffffffff390;
  char *in_stack_fffffffffffff398;
  char *key;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  *in_stack_fffffffffffff3a0;
  BaseTimeCoordinator *in_stack_fffffffffffff3a8;
  BaseTimeCoordinator *this_03;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  *in_stack_fffffffffffff3b0;
  HandleManager *this_04;
  JsonErrorCodes code;
  json *in_stack_fffffffffffff3b8;
  LogLevels level;
  LogBuffer *in_stack_fffffffffffff3c0;
  undefined4 in_stack_fffffffffffff3cc;
  BrokerState state;
  undefined4 in_stack_fffffffffffff3e8;
  undefined4 in_stack_fffffffffffff3ec;
  undefined4 in_stack_fffffffffffff3f0;
  undefined2 in_stack_fffffffffffff3f4;
  undefined1 in_stack_fffffffffffff3f6;
  undefined1 in_stack_fffffffffffff3f7;
  char *in_stack_fffffffffffff3f8;
  undefined8 in_stack_fffffffffffff420;
  undefined1 hasParent;
  json *in_stack_fffffffffffff428;
  BrokerBase *in_stack_fffffffffffff430;
  unsigned_long_long in_stack_fffffffffffff5b0;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 in_stack_fffffffffffff5b8;
  char *in_stack_fffffffffffff5c0;
  size_t in_stack_fffffffffffff5c8;
  undefined4 in_stack_fffffffffffff670;
  undefined4 in_stack_fffffffffffff674;
  CoreBroker *in_stack_fffffffffffff678;
  CoreBroker *in_stack_fffffffffffff6a0;
  size_t in_stack_fffffffffffff6a8;
  char *in_stack_fffffffffffff6b0;
  undefined1 local_8e1 [57];
  GlobalFederateId *local_8a8;
  GlobalFederateId *local_8a0;
  __normal_iterator<helics::GlobalFederateId_*,_std::vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>_>
  local_898;
  undefined1 local_890 [24];
  undefined1 *local_878;
  initializer_list<nlohmann::json_abi_v3_11_3::detail::json_ref<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
  local_870 [2];
  BaseType local_84c;
  GlobalFederateId *local_838;
  GlobalFederateId *local_830;
  __normal_iterator<helics::GlobalFederateId_*,_std::vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>_>
  local_828;
  undefined1 local_820 [24];
  undefined1 *local_808;
  initializer_list<nlohmann::json_abi_v3_11_3::detail::json_ref<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
  local_800;
  char local_7f0 [16];
  BaseTimeCoordinator local_7e0;
  function<void_(nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_&)>
  *in_stack_fffffffffffff878;
  HandleManager *in_stack_fffffffffffff880;
  undefined8 in_stack_fffffffffffff888;
  GlobalFederateId fed_00;
  string_view in_stack_fffffffffffff890;
  GlobalFederateId local_70c [3];
  void *pvStack_700;
  allocator<char> local_6cd;
  int local_6cc;
  undefined8 local_6c8;
  void *pvStack_6c0;
  allocator<char> local_6b5;
  int local_6b4;
  __tuple_element_t<0UL,_tuple<JsonMapBuilder,_vector<ActionMessage,_allocator<ActionMessage>_>,_QueryReuse>_>
  *local_6b0;
  unsigned_short local_6a2;
  _Self local_6a0;
  _Self local_698;
  basic_string_view<char,_std::char_traits<char>_> local_690;
  undefined4 local_67c;
  undefined8 local_638;
  void *local_630;
  allocator<char> local_621;
  double local_620;
  char *local_618;
  undefined8 local_610;
  undefined8 local_5f8;
  void *local_5f0;
  allocator<char> local_5e1 [25];
  void *local_5c8;
  BaseType local_5bc;
  BaseType local_5a4;
  initializer_list<nlohmann::json_abi_v3_11_3::detail::json_ref<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
  local_580 [4];
  reference local_540;
  BasicBrokerInfo *local_538;
  __normal_iterator<const_helics::BasicBrokerInfo_*,_std::vector<helics::BasicBrokerInfo,_std::allocator<helics::BasicBrokerInfo>_>_>
  local_530;
  DualStringMappedVector<helics::BasicBrokerInfo,_helics::GlobalBrokerId,_(reference_stability)1,_5>
  *local_528;
  initializer_list<nlohmann::json_abi_v3_11_3::detail::json_ref<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
  local_520 [2];
  initializer_list<nlohmann::json_abi_v3_11_3::detail::json_ref<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
  local_500 [2];
  BaseType local_4dc;
  BaseType local_4c4;
  initializer_list<nlohmann::json_abi_v3_11_3::detail::json_ref<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
  local_490 [3];
  reference local_460;
  BasicFedInfo *local_458;
  __normal_iterator<const_helics::BasicFedInfo_*,_std::vector<helics::BasicFedInfo,_std::allocator<helics::BasicFedInfo>_>_>
  local_450;
  DualStringMappedVector<helics::BasicFedInfo,_helics::GlobalFederateId,_(reference_stability)1,_5>
  *local_448;
  undefined1 in_stack_fffffffffffffbcc;
  QueryReuse in_stack_fffffffffffffbcd;
  uint16_t in_stack_fffffffffffffbce;
  CoreBroker *in_stack_fffffffffffffbd0;
  undefined1 in_stack_fffffffffffffbd8 [15];
  undefined1 in_stack_fffffffffffffbe7;
  allocator<char> local_2f1 [89];
  void *local_298;
  undefined1 local_289;
  BaseType local_244;
  BaseType local_22c;
  undefined8 local_1d8;
  void *local_1d0;
  undefined8 local_1b8;
  void *local_1b0;
  undefined4 local_1a4;
  int local_18c;
  undefined4 local_174;
  undefined4 local_15c;
  undefined8 local_118;
  void *local_110;
  undefined4 local_104;
  byte local_c1;
  undefined8 local_b8;
  void *pvStack_b0;
  __int_type local_9c;
  memory_order local_98;
  int local_94;
  atomic<int> *local_90;
  double local_88 [4];
  undefined8 local_68;
  double *local_60;
  char *local_58;
  undefined8 uStack_50;
  string *local_48;
  double *local_40;
  char *local_38;
  undefined8 uStack_30;
  double local_20;
  double *local_18;
  double *local_10;
  undefined8 *local_8;
  
  hasParent = (undefined1)((ulong)in_stack_fffffffffffff420 >> 0x38);
  fed_00.gid = SUB84(in_stack_fffffffffffff888,4);
  state = (BrokerState)((uint)in_stack_fffffffffffff3cc >> 0x10);
  local_c1 = in_R8B & 1;
  request_00._M_str = in_stack_fffffffffffff6b0;
  request_00._M_len = in_stack_fffffffffffff6a8;
  local_b8 = in_RDX;
  pvStack_b0 = in_RCX;
  quickBrokerQueries_abi_cxx11_(in_stack_fffffffffffff6a0,request_00);
  bVar1 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          empty((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x52a5d8);
  if (bVar1) {
    local_118 = local_b8;
    local_110 = pvStack_b0;
    CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)
               CONCAT44(in_stack_fffffffffffff364,in_stack_fffffffffffff360),
               (char *)in_stack_fffffffffffff358);
    __x._M_str = (char *)in_stack_fffffffffffff380;
    __x._M_len = (size_t)in_stack_fffffffffffff378;
    __y._M_str = (char *)in_stack_fffffffffffff370;
    __y._M_len = (size_t)in_stack_fffffffffffff368;
    bVar1 = std::operator==(__x,__y);
    if (bVar1) {
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                    *)in_stack_fffffffffffff350,in_stack_fffffffffffff348);
      generateQueryAnswer::anon_class_8_1_8991fb9c::operator()
                ((anon_class_8_1_8991fb9c *)in_stack_fffffffffffff350,
                 (json *)in_stack_fffffffffffff348);
      sVar4 = gmlc::containers::
              DualStringMappedVector<helics::BasicBrokerInfo,_helics::GlobalBrokerId,_(reference_stability)1,_5>
              ::size((DualStringMappedVector<helics::BasicBrokerInfo,_helics::GlobalBrokerId,_(reference_stability)1,_5>
                      *)0x52a6a7);
      local_15c = (undefined4)sVar4;
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::basic_json<int,_int,_0>
                ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  *)in_stack_fffffffffffff350,(int *)in_stack_fffffffffffff348);
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
      ::operator[]<char_const>(in_stack_fffffffffffff3a0,in_stack_fffffffffffff398);
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::operator=((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                   *)CONCAT44(in_stack_fffffffffffff364,in_stack_fffffffffffff360),
                  (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                   *)in_stack_fffffffffffff358);
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                     *)in_stack_fffffffffffff350);
      sVar4 = gmlc::containers::
              DualStringMappedVector<helics::BasicFedInfo,_helics::GlobalFederateId,_(reference_stability)1,_5>
              ::size((DualStringMappedVector<helics::BasicFedInfo,_helics::GlobalFederateId,_(reference_stability)1,_5>
                      *)0x52a731);
      local_174 = (undefined4)sVar4;
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::basic_json<int,_int,_0>
                ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  *)in_stack_fffffffffffff350,(int *)in_stack_fffffffffffff348);
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
      ::operator[]<char_const>(in_stack_fffffffffffff3a0,in_stack_fffffffffffff398);
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::operator=((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                   *)CONCAT44(in_stack_fffffffffffff364,in_stack_fffffffffffff360),
                  (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                   *)in_stack_fffffffffffff358);
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                     *)in_stack_fffffffffffff350);
      local_18c = getCountableFederates(in_stack_fffffffffffff370);
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::basic_json<int,_int,_0>
                ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  *)in_stack_fffffffffffff350,(int *)in_stack_fffffffffffff348);
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
      ::operator[]<char_const>(in_stack_fffffffffffff3a0,in_stack_fffffffffffff398);
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::operator=((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                   *)CONCAT44(in_stack_fffffffffffff364,in_stack_fffffffffffff360),
                  (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                   *)in_stack_fffffffffffff358);
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                     *)in_stack_fffffffffffff350);
      sVar4 = HandleManager::size((HandleManager *)0x52a83c);
      local_1a4 = (undefined4)sVar4;
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::basic_json<int,_int,_0>
                ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  *)in_stack_fffffffffffff350,(int *)in_stack_fffffffffffff348);
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
      ::operator[]<char_const>(in_stack_fffffffffffff3a0,in_stack_fffffffffffff398);
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::operator=((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                   *)CONCAT44(in_stack_fffffffffffff364,in_stack_fffffffffffff360),
                  (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                   *)in_stack_fffffffffffff358);
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                     *)in_stack_fffffffffffff350);
      fileops::generateJsonString
                ((json *)in_stack_fffffffffffff358,SUB81((ulong)in_stack_fffffffffffff350 >> 0x38,0)
                );
      local_104 = 1;
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                     *)in_stack_fffffffffffff350);
    }
    else {
      local_1b8 = local_b8;
      local_1b0 = pvStack_b0;
      CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)
                 CONCAT44(in_stack_fffffffffffff364,in_stack_fffffffffffff360),
                 (char *)in_stack_fffffffffffff358);
      __x_00._M_str = (char *)in_stack_fffffffffffff380;
      __x_00._M_len = (size_t)in_stack_fffffffffffff378;
      __y_00._M_str = (char *)in_stack_fffffffffffff370;
      __y_00._M_len = (size_t)in_stack_fffffffffffff368;
      bVar1 = std::operator==(__x_00,__y_00);
      if (bVar1) {
        generateFederationSummary_abi_cxx11_(in_stack_fffffffffffff678);
        local_104 = 1;
      }
      else {
        local_1d8 = local_b8;
        local_1d0 = pvStack_b0;
        CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)
                   CONCAT44(in_stack_fffffffffffff364,in_stack_fffffffffffff360),
                   (char *)in_stack_fffffffffffff358);
        __x_01._M_str = (char *)in_stack_fffffffffffff380;
        __x_01._M_len = (size_t)in_stack_fffffffffffff378;
        __y_01._M_str = (char *)in_stack_fffffffffffff370;
        __y_01._M_len = (size_t)in_stack_fffffffffffff368;
        bVar1 = std::operator==(__x_01,__y_01);
        if (bVar1) {
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                        *)in_stack_fffffffffffff350,in_stack_fffffffffffff348);
          level = (LogLevels)((ulong)in_stack_fffffffffffff3b8 >> 0x20);
          getIdentifier_abi_cxx11_(in_RSI);
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::
          basic_json<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                    ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                      *)in_stack_fffffffffffff370,in_stack_fffffffffffff368);
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
          ::operator[]<char_const>(in_stack_fffffffffffff3a0,in_stack_fffffffffffff398);
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::operator=((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                       *)CONCAT44(in_stack_fffffffffffff364,in_stack_fffffffffffff360),
                      (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                       *)in_stack_fffffffffffff358);
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                         *)in_stack_fffffffffffff350);
          if (((in_RSI->super_BrokerBase).uuid_like & 1U) != 0) {
            getIdentifier_abi_cxx11_(in_RSI);
            nlohmann::json_abi_v3_11_3::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
            ::
            basic_json<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                      ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                        *)in_stack_fffffffffffff370,in_stack_fffffffffffff368);
            nlohmann::json_abi_v3_11_3::
            basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
            ::operator[]<char_const>(in_stack_fffffffffffff3a0,in_stack_fffffffffffff398);
            nlohmann::json_abi_v3_11_3::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
            ::operator=((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                         *)CONCAT44(in_stack_fffffffffffff364,in_stack_fffffffffffff360),
                        (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                         *)in_stack_fffffffffffff358);
            nlohmann::json_abi_v3_11_3::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
            ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                           *)in_stack_fffffffffffff350);
          }
          if (((in_RSI->super_BrokerBase).field_0x294 & 1) == 0) {
            local_22c = GlobalBrokerId::baseValue(&(in_RSI->super_BrokerBase).higher_broker_id);
            nlohmann::json_abi_v3_11_3::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
            ::basic_json<int,_int,_0>
                      ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                        *)in_stack_fffffffffffff350,(int *)in_stack_fffffffffffff348);
            nlohmann::json_abi_v3_11_3::
            basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
            ::operator[]<char_const>(in_stack_fffffffffffff3a0,in_stack_fffffffffffff398);
            nlohmann::json_abi_v3_11_3::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
            ::operator=((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                         *)CONCAT44(in_stack_fffffffffffff364,in_stack_fffffffffffff360),
                        (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                         *)in_stack_fffffffffffff358);
            nlohmann::json_abi_v3_11_3::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
            ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                           *)in_stack_fffffffffffff350);
          }
          local_244 = GlobalBrokerId::baseValue(&(in_RSI->super_BrokerBase).global_broker_id_local);
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::basic_json<int,_int,_0>
                    ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                      *)in_stack_fffffffffffff350,(int *)in_stack_fffffffffffff348);
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
          ::operator[]<char_const>(in_stack_fffffffffffff3a0,in_stack_fffffffffffff398);
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::operator=((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                       *)CONCAT44(in_stack_fffffffffffff364,in_stack_fffffffffffff360),
                      (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                       *)in_stack_fffffffffffff358);
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                         *)in_stack_fffffffffffff350);
          paVar5 = &(in_RSI->super_BrokerBase).maxLogLevel;
          local_94 = 5;
          local_90 = paVar5;
          local_98 = CLI::std::operator&(seq_cst,__memory_order_mask);
          if (local_94 - 1U < 2) {
            local_9c = (paVar5->super___atomic_base<int>)._M_i;
          }
          else if (local_94 == 5) {
            local_9c = (paVar5->super___atomic_base<int>)._M_i;
          }
          else {
            local_9c = (paVar5->super___atomic_base<int>)._M_i;
          }
          logLevelToString_abi_cxx11_(level);
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::
          basic_json<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                    ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                      *)in_stack_fffffffffffff370,in_stack_fffffffffffff368);
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
          ::operator[]<char_const>(in_stack_fffffffffffff3a0,in_stack_fffffffffffff398);
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::operator=((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                       *)CONCAT44(in_stack_fffffffffffff364,in_stack_fffffffffffff360),
                      (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                       *)in_stack_fffffffffffff358);
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                         *)in_stack_fffffffffffff350);
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff350);
          local_289 = isRoot((CoreBroker *)0x52ae7b);
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::basic_json<bool,_bool,_0>
                    ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                      *)in_stack_fffffffffffff350,(bool *)in_stack_fffffffffffff348);
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
          ::operator[]<char_const>(in_stack_fffffffffffff3a0,in_stack_fffffffffffff398);
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::operator=((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                       *)CONCAT44(in_stack_fffffffffffff364,in_stack_fffffffffffff360),
                      (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                       *)in_stack_fffffffffffff358);
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                         *)in_stack_fffffffffffff350);
          fileops::generateJsonString
                    ((json *)in_stack_fffffffffffff358,
                     SUB81((ulong)in_stack_fffffffffffff350 >> 0x38,0));
          local_104 = 1;
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                         *)in_stack_fffffffffffff350);
        }
        else {
          local_2f1._81_8_ = local_b8;
          local_298 = pvStack_b0;
          CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    ((basic_string_view<char,_std::char_traits<char>_> *)
                     CONCAT44(in_stack_fffffffffffff364,in_stack_fffffffffffff360),
                     (char *)in_stack_fffffffffffff358);
          __x_02._M_str = (char *)in_stack_fffffffffffff380;
          __x_02._M_len = (size_t)in_stack_fffffffffffff378;
          __y_02._M_str = (char *)in_stack_fffffffffffff370;
          __y_02._M_len = (size_t)in_stack_fffffffffffff368;
          bVar1 = std::operator==(__x_02,__y_02);
          if (bVar1) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffff390,
                       (char *)CONCAT44(in_stack_fffffffffffff38c,in_stack_fffffffffffff388),
                       (allocator<char> *)in_stack_fffffffffffff380);
            std::operator+(in_stack_fffffffffffff358,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           in_stack_fffffffffffff350);
            std::operator+(in_stack_fffffffffffff358,
                           (char)((ulong)in_stack_fffffffffffff350 >> 0x38));
            std::__cxx11::string::~string
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffff350);
            std::__cxx11::string::~string
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffff350);
            std::allocator<char>::~allocator(local_2f1);
            local_104 = 1;
          }
          else {
            CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                      ((basic_string_view<char,_std::char_traits<char>_> *)
                       CONCAT44(in_stack_fffffffffffff364,in_stack_fffffffffffff360),
                       (char *)in_stack_fffffffffffff358);
            __x_03._M_str = (char *)in_stack_fffffffffffff380;
            __x_03._M_len = (size_t)in_stack_fffffffffffff378;
            __y_03._M_str = (char *)in_stack_fffffffffffff370;
            __y_03._M_len = (size_t)in_stack_fffffffffffff368;
            bVar1 = std::operator==(__x_03,__y_03);
            if (bVar1) {
              nlohmann::json_abi_v3_11_3::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
              ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                            *)in_stack_fffffffffffff350,in_stack_fffffffffffff348);
              BrokerBase::addBaseInformation
                        (in_stack_fffffffffffff430,in_stack_fffffffffffff428,(bool)hasParent);
              this_00 = CLI::std::
                        __shared_ptr_access<helics::LogManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        ::operator->((__shared_ptr_access<helics::LogManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                      *)0x52b1fb);
              LogManager::getLogBuffer(this_00);
              bufferToJson(in_stack_fffffffffffff3c0,in_stack_fffffffffffff3b8);
              fileops::generateJsonString
                        ((json *)in_stack_fffffffffffff358,
                         SUB81((ulong)in_stack_fffffffffffff350 >> 0x38,0));
              local_104 = 1;
              nlohmann::json_abi_v3_11_3::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
              ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                             *)in_stack_fffffffffffff350);
            }
            else {
              CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                        ((basic_string_view<char,_std::char_traits<char>_> *)
                         CONCAT44(in_stack_fffffffffffff364,in_stack_fffffffffffff360),
                         (char *)in_stack_fffffffffffff358);
              __x_04._M_str = (char *)in_stack_fffffffffffff380;
              __x_04._M_len = (size_t)in_stack_fffffffffffff378;
              __y_04._M_str = (char *)in_stack_fffffffffffff370;
              __y_04._M_len = (size_t)in_stack_fffffffffffff368;
              bVar1 = std::operator==(__x_04,__y_04);
              if (bVar1) {
                generateStringVector<gmlc::containers::DualStringMappedVector<helics::BasicFedInfo,helics::GlobalFederateId,(reference_stability)1,5>,helics::CoreBroker::generateQueryAnswer[abi:cxx11](std::basic_string_view<char,std::char_traits<char>>,bool)::__1>
                          (in_RDI,&in_RSI->mFederates);
                local_104 = 1;
              }
              else {
                CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                          ((basic_string_view<char,_std::char_traits<char>_> *)
                           CONCAT44(in_stack_fffffffffffff364,in_stack_fffffffffffff360),
                           (char *)in_stack_fffffffffffff358);
                __x_05._M_str = (char *)in_stack_fffffffffffff380;
                __x_05._M_len = (size_t)in_stack_fffffffffffff378;
                __y_05._M_str = (char *)in_stack_fffffffffffff370;
                __y_05._M_len = (size_t)in_stack_fffffffffffff368;
                bVar1 = std::operator==(__x_05,__y_05);
                if (bVar1) {
                  generateStringVector<gmlc::containers::DualStringMappedVector<helics::BasicBrokerInfo,helics::GlobalBrokerId,(reference_stability)1,5>,helics::CoreBroker::generateQueryAnswer[abi:cxx11](std::basic_string_view<char,std::char_traits<char>>,bool)::__2>
                            (in_RDI,&in_RSI->mBrokers);
                  local_104 = 1;
                }
                else {
                  CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                            ((basic_string_view<char,_std::char_traits<char>_> *)
                             CONCAT44(in_stack_fffffffffffff364,in_stack_fffffffffffff360),
                             (char *)in_stack_fffffffffffff358);
                  __x_06._M_str = (char *)in_stack_fffffffffffff380;
                  __x_06._M_len = (size_t)in_stack_fffffffffffff378;
                  __y_06._M_str = (char *)in_stack_fffffffffffff370;
                  __y_06._M_len = (size_t)in_stack_fffffffffffff368;
                  bVar1 = std::operator==(__x_06,__y_06);
                  if (bVar1) {
                    generateStringVector_if<gmlc::containers::DualStringMappedVector<helics::BasicBrokerInfo,helics::GlobalBrokerId,(reference_stability)1,5>,helics::CoreBroker::generateQueryAnswer[abi:cxx11](std::basic_string_view<char,std::char_traits<char>>,bool)::__3,helics::CoreBroker::generateQueryAnswer[abi:cxx11](std::basic_string_view<char,std::char_traits<char>>,bool)::__4>
                              (in_RDI,&in_RSI->mBrokers);
                    local_104 = 1;
                  }
                  else {
                    CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                              ((basic_string_view<char,_std::char_traits<char>_> *)
                               CONCAT44(in_stack_fffffffffffff364,in_stack_fffffffffffff360),
                               (char *)in_stack_fffffffffffff358);
                    __x_07._M_str = (char *)in_stack_fffffffffffff380;
                    __x_07._M_len = (size_t)in_stack_fffffffffffff378;
                    __y_07._M_str = (char *)in_stack_fffffffffffff370;
                    __y_07._M_len = (size_t)in_stack_fffffffffffff368;
                    bVar1 = std::operator==(__x_07,__y_07);
                    if (bVar1) {
                      generateStringVector_if<gmlc::containers::DualStringMappedVector<helics::BasicBrokerInfo,helics::GlobalBrokerId,(reference_stability)1,5>,helics::CoreBroker::generateQueryAnswer[abi:cxx11](std::basic_string_view<char,std::char_traits<char>>,bool)::__5,helics::CoreBroker::generateQueryAnswer[abi:cxx11](std::basic_string_view<char,std::char_traits<char>>,bool)::__6>
                                (in_RDI,&in_RSI->mBrokers);
                      local_104 = 1;
                    }
                    else {
                      CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                                ((basic_string_view<char,_std::char_traits<char>_> *)
                                 CONCAT44(in_stack_fffffffffffff364,in_stack_fffffffffffff360),
                                 (char *)in_stack_fffffffffffff358);
                      __x_08._M_str = (char *)in_stack_fffffffffffff380;
                      __x_08._M_len = (size_t)in_stack_fffffffffffff378;
                      __y_08._M_str = (char *)in_stack_fffffffffffff370;
                      __y_08._M_len = (size_t)in_stack_fffffffffffff368;
                      bVar1 = std::operator==(__x_08,__y_08);
                      if (bVar1) {
                        nlohmann::json_abi_v3_11_3::
                        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                        ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                      *)in_stack_fffffffffffff350,in_stack_fffffffffffff348);
                        BrokerBase::addBaseInformation
                                  (in_stack_fffffffffffff430,in_stack_fffffffffffff428,
                                   (bool)hasParent);
                        BrokerBase::getBrokerState((BrokerBase *)0x52b56f);
                        brokerStateName_abi_cxx11_(state);
                        nlohmann::json_abi_v3_11_3::
                        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                        ::
                        basic_json<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                                  ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                    *)in_stack_fffffffffffff370,in_stack_fffffffffffff368);
                        nlohmann::json_abi_v3_11_3::
                        basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                        ::operator[]<char_const>
                                  (in_stack_fffffffffffff3a0,in_stack_fffffffffffff398);
                        nlohmann::json_abi_v3_11_3::
                        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                        ::operator=((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                     *)CONCAT44(in_stack_fffffffffffff364,in_stack_fffffffffffff360)
                                    ,(basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                      *)in_stack_fffffffffffff358);
                        nlohmann::json_abi_v3_11_3::
                        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                        ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                       *)in_stack_fffffffffffff350);
                        isConnected(in_stack_fffffffffffff350);
                        nlohmann::json_abi_v3_11_3::
                        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                        ::basic_json<bool,_bool,_0>
                                  ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                    *)in_stack_fffffffffffff350,(bool *)in_stack_fffffffffffff348);
                        nlohmann::json_abi_v3_11_3::
                        basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                        ::operator[]<char_const>
                                  (in_stack_fffffffffffff3a0,in_stack_fffffffffffff398);
                        nlohmann::json_abi_v3_11_3::
                        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                        ::operator=((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                     *)CONCAT44(in_stack_fffffffffffff364,in_stack_fffffffffffff360)
                                    ,(basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                      *)in_stack_fffffffffffff358);
                        nlohmann::json_abi_v3_11_3::
                        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                        ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                       *)in_stack_fffffffffffff350);
                        CLI::std::
                        initializer_list<nlohmann::json_abi_v3_11_3::detail::json_ref<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
                        ::initializer_list((initializer_list<nlohmann::json_abi_v3_11_3::detail::json_ref<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
                                            *)&stack0xfffffffffffffbc0);
                        init._M_array._4_4_ = in_stack_fffffffffffff364;
                        init._M_array._0_4_ = in_stack_fffffffffffff360;
                        init._M_len = (size_type)in_stack_fffffffffffff368;
                        nlohmann::json_abi_v3_11_3::
                        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                        ::array(init);
                        nlohmann::json_abi_v3_11_3::
                        basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                        ::operator[]<char_const>
                                  (in_stack_fffffffffffff3a0,in_stack_fffffffffffff398);
                        nlohmann::json_abi_v3_11_3::
                        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                        ::operator=((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                     *)CONCAT44(in_stack_fffffffffffff364,in_stack_fffffffffffff360)
                                    ,(basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                      *)in_stack_fffffffffffff358);
                        nlohmann::json_abi_v3_11_3::
                        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                        ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                       *)in_stack_fffffffffffff350);
                        local_448 = &in_RSI->mFederates;
                        local_450._M_current =
                             (BasicFedInfo *)
                             gmlc::containers::
                             DualStringMappedVector<helics::BasicFedInfo,_helics::GlobalFederateId,_(reference_stability)1,_5>
                             ::begin((DualStringMappedVector<helics::BasicFedInfo,_helics::GlobalFederateId,_(reference_stability)1,_5>
                                      *)in_stack_fffffffffffff348);
                        local_458 = (BasicFedInfo *)
                                    gmlc::containers::
                                    DualStringMappedVector<helics::BasicFedInfo,_helics::GlobalFederateId,_(reference_stability)1,_5>
                                    ::end((DualStringMappedVector<helics::BasicFedInfo,_helics::GlobalFederateId,_(reference_stability)1,_5>
                                           *)in_stack_fffffffffffff348);
                        while (bVar1 = __gnu_cxx::
                                       operator==<const_helics::BasicFedInfo_*,_std::vector<helics::BasicFedInfo,_std::allocator<helics::BasicFedInfo>_>_>
                                                 ((
                                                  __normal_iterator<const_helics::BasicFedInfo_*,_std::vector<helics::BasicFedInfo,_std::allocator<helics::BasicFedInfo>_>_>
                                                  *)in_stack_fffffffffffff350,
                                                  (
                                                  __normal_iterator<const_helics::BasicFedInfo_*,_std::vector<helics::BasicFedInfo,_std::allocator<helics::BasicFedInfo>_>_>
                                                  *)in_stack_fffffffffffff348),
                              ((bVar1 ^ 0xffU) & 1) != 0) {
                          local_460 = __gnu_cxx::
                                      __normal_iterator<const_helics::BasicFedInfo_*,_std::vector<helics::BasicFedInfo,_std::allocator<helics::BasicFedInfo>_>_>
                                      ::operator*(&local_450);
                          nlohmann::json_abi_v3_11_3::
                          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                          ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                        *)in_stack_fffffffffffff350,in_stack_fffffffffffff348);
                          CLI::std::
                          initializer_list<nlohmann::json_abi_v3_11_3::detail::json_ref<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
                          ::initializer_list(local_490);
                          init_00._M_array._4_4_ = in_stack_fffffffffffff364;
                          init_00._M_array._0_4_ = in_stack_fffffffffffff360;
                          init_00._M_len = (size_type)in_stack_fffffffffffff368;
                          nlohmann::json_abi_v3_11_3::
                          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                          ::object(init_00);
                          nlohmann::json_abi_v3_11_3::
                          basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                          ::operator[]<char_const>
                                    (in_stack_fffffffffffff3a0,in_stack_fffffffffffff398);
                          nlohmann::json_abi_v3_11_3::
                          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                          ::operator=((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                       *)CONCAT44(in_stack_fffffffffffff364,
                                                  in_stack_fffffffffffff360),
                                      (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                       *)in_stack_fffffffffffff358);
                          nlohmann::json_abi_v3_11_3::
                          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                          ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                         *)in_stack_fffffffffffff350);
                          nlohmann::json_abi_v3_11_3::
                          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                          ::
                          basic_json<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                                    ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                      *)in_stack_fffffffffffff370,in_stack_fffffffffffff368);
                          nlohmann::json_abi_v3_11_3::
                          basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                          ::operator[]<char_const>
                                    (in_stack_fffffffffffff3a0,in_stack_fffffffffffff398);
                          nlohmann::json_abi_v3_11_3::
                          basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                          ::operator[]<char_const>
                                    (in_stack_fffffffffffff3a0,in_stack_fffffffffffff398);
                          nlohmann::json_abi_v3_11_3::
                          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                          ::operator=((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                       *)CONCAT44(in_stack_fffffffffffff364,
                                                  in_stack_fffffffffffff360),
                                      (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                       *)in_stack_fffffffffffff358);
                          nlohmann::json_abi_v3_11_3::
                          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                          ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                         *)in_stack_fffffffffffff350);
                          stateString_abi_cxx11_
                                    ((ConnectionState)((uint)in_stack_fffffffffffff38c >> 0x18));
                          nlohmann::json_abi_v3_11_3::
                          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                          ::
                          basic_json<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                                    ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                      *)in_stack_fffffffffffff370,in_stack_fffffffffffff368);
                          nlohmann::json_abi_v3_11_3::
                          basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                          ::operator[]<char_const>
                                    (in_stack_fffffffffffff3a0,in_stack_fffffffffffff398);
                          nlohmann::json_abi_v3_11_3::
                          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                          ::operator=((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                       *)CONCAT44(in_stack_fffffffffffff364,
                                                  in_stack_fffffffffffff360),
                                      (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                       *)in_stack_fffffffffffff358);
                          nlohmann::json_abi_v3_11_3::
                          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                          ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                         *)in_stack_fffffffffffff350);
                          local_4c4 = GlobalFederateId::baseValue(&local_460->global_id);
                          nlohmann::json_abi_v3_11_3::
                          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                          ::basic_json<int,_int,_0>
                                    ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                      *)in_stack_fffffffffffff350,(int *)in_stack_fffffffffffff348);
                          nlohmann::json_abi_v3_11_3::
                          basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                          ::operator[]<char_const>
                                    (in_stack_fffffffffffff3a0,in_stack_fffffffffffff398);
                          nlohmann::json_abi_v3_11_3::
                          basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                          ::operator[]<char_const>
                                    (in_stack_fffffffffffff3a0,in_stack_fffffffffffff398);
                          nlohmann::json_abi_v3_11_3::
                          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                          ::operator=((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                       *)CONCAT44(in_stack_fffffffffffff364,
                                                  in_stack_fffffffffffff360),
                                      (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                       *)in_stack_fffffffffffff358);
                          nlohmann::json_abi_v3_11_3::
                          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                          ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                         *)in_stack_fffffffffffff350);
                          local_4dc = GlobalBrokerId::baseValue(&local_460->parent);
                          nlohmann::json_abi_v3_11_3::
                          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                          ::basic_json<int,_int,_0>
                                    ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                      *)in_stack_fffffffffffff350,(int *)in_stack_fffffffffffff348);
                          nlohmann::json_abi_v3_11_3::
                          basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                          ::operator[]<char_const>
                                    (in_stack_fffffffffffff3a0,in_stack_fffffffffffff398);
                          nlohmann::json_abi_v3_11_3::
                          basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                          ::operator[]<char_const>
                                    (in_stack_fffffffffffff3a0,in_stack_fffffffffffff398);
                          nlohmann::json_abi_v3_11_3::
                          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                          ::operator=((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                       *)CONCAT44(in_stack_fffffffffffff364,
                                                  in_stack_fffffffffffff360),
                                      (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                       *)in_stack_fffffffffffff358);
                          nlohmann::json_abi_v3_11_3::
                          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                          ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                         *)in_stack_fffffffffffff350);
                          nlohmann::json_abi_v3_11_3::
                          basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                          ::operator[]<char_const>
                                    (in_stack_fffffffffffff3a0,in_stack_fffffffffffff398);
                          nlohmann::json_abi_v3_11_3::
                          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                          ::push_back(in_stack_fffffffffffff3b0,
                                      (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                       *)in_stack_fffffffffffff3a8);
                          nlohmann::json_abi_v3_11_3::
                          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                          ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                         *)in_stack_fffffffffffff350);
                          __gnu_cxx::
                          __normal_iterator<const_helics::BasicFedInfo_*,_std::vector<helics::BasicFedInfo,_std::allocator<helics::BasicFedInfo>_>_>
                          ::operator++(&local_450);
                        }
                        CLI::std::
                        initializer_list<nlohmann::json_abi_v3_11_3::detail::json_ref<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
                        ::initializer_list(local_500);
                        init_01._M_array._4_4_ = in_stack_fffffffffffff364;
                        init_01._M_array._0_4_ = in_stack_fffffffffffff360;
                        init_01._M_len = (size_type)in_stack_fffffffffffff368;
                        nlohmann::json_abi_v3_11_3::
                        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                        ::array(init_01);
                        nlohmann::json_abi_v3_11_3::
                        basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                        ::operator[]<char_const>
                                  (in_stack_fffffffffffff3a0,in_stack_fffffffffffff398);
                        nlohmann::json_abi_v3_11_3::
                        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                        ::operator=((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                     *)CONCAT44(in_stack_fffffffffffff364,in_stack_fffffffffffff360)
                                    ,(basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                      *)in_stack_fffffffffffff358);
                        nlohmann::json_abi_v3_11_3::
                        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                        ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                       *)in_stack_fffffffffffff350);
                        CLI::std::
                        initializer_list<nlohmann::json_abi_v3_11_3::detail::json_ref<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
                        ::initializer_list(local_520);
                        init_02._M_array._4_4_ = in_stack_fffffffffffff364;
                        init_02._M_array._0_4_ = in_stack_fffffffffffff360;
                        init_02._M_len = (size_type)in_stack_fffffffffffff368;
                        nlohmann::json_abi_v3_11_3::
                        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                        ::array(init_02);
                        nlohmann::json_abi_v3_11_3::
                        basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                        ::operator[]<char_const>
                                  (in_stack_fffffffffffff3a0,in_stack_fffffffffffff398);
                        nlohmann::json_abi_v3_11_3::
                        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                        ::operator=((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                     *)CONCAT44(in_stack_fffffffffffff364,in_stack_fffffffffffff360)
                                    ,(basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                      *)in_stack_fffffffffffff358);
                        nlohmann::json_abi_v3_11_3::
                        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                        ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                       *)in_stack_fffffffffffff350);
                        local_528 = &in_RSI->mBrokers;
                        local_530._M_current =
                             (BasicBrokerInfo *)
                             gmlc::containers::
                             DualStringMappedVector<helics::BasicBrokerInfo,_helics::GlobalBrokerId,_(reference_stability)1,_5>
                             ::begin(in_stack_fffffffffffff348);
                        local_538 = (BasicBrokerInfo *)
                                    gmlc::containers::
                                    DualStringMappedVector<helics::BasicBrokerInfo,_helics::GlobalBrokerId,_(reference_stability)1,_5>
                                    ::end(in_stack_fffffffffffff348);
                        while (bVar1 = __gnu_cxx::
                                       operator==<const_helics::BasicBrokerInfo_*,_std::vector<helics::BasicBrokerInfo,_std::allocator<helics::BasicBrokerInfo>_>_>
                                                 ((
                                                  __normal_iterator<const_helics::BasicBrokerInfo_*,_std::vector<helics::BasicBrokerInfo,_std::allocator<helics::BasicBrokerInfo>_>_>
                                                  *)in_stack_fffffffffffff350,
                                                  (
                                                  __normal_iterator<const_helics::BasicBrokerInfo_*,_std::vector<helics::BasicBrokerInfo,_std::allocator<helics::BasicBrokerInfo>_>_>
                                                  *)in_stack_fffffffffffff348),
                              ((bVar1 ^ 0xffU) & 1) != 0) {
                          local_540 = __gnu_cxx::
                                      __normal_iterator<const_helics::BasicBrokerInfo_*,_std::vector<helics::BasicBrokerInfo,_std::allocator<helics::BasicBrokerInfo>_>_>
                                      ::operator*(&local_530);
                          nlohmann::json_abi_v3_11_3::
                          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                          ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                        *)in_stack_fffffffffffff350,in_stack_fffffffffffff348);
                          stateString_abi_cxx11_
                                    ((ConnectionState)((uint)in_stack_fffffffffffff38c >> 0x18));
                          nlohmann::json_abi_v3_11_3::
                          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                          ::
                          basic_json<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                                    ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                      *)in_stack_fffffffffffff370,in_stack_fffffffffffff368);
                          nlohmann::json_abi_v3_11_3::
                          basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                          ::operator[]<char_const>
                                    (in_stack_fffffffffffff3a0,in_stack_fffffffffffff398);
                          nlohmann::json_abi_v3_11_3::
                          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                          ::operator=((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                       *)CONCAT44(in_stack_fffffffffffff364,
                                                  in_stack_fffffffffffff360),
                                      (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                       *)in_stack_fffffffffffff358);
                          nlohmann::json_abi_v3_11_3::
                          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                          ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                         *)in_stack_fffffffffffff350);
                          CLI::std::
                          initializer_list<nlohmann::json_abi_v3_11_3::detail::json_ref<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
                          ::initializer_list(local_580);
                          init_03._M_array._4_4_ = in_stack_fffffffffffff364;
                          init_03._M_array._0_4_ = in_stack_fffffffffffff360;
                          init_03._M_len = (size_type)in_stack_fffffffffffff368;
                          nlohmann::json_abi_v3_11_3::
                          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                          ::object(init_03);
                          nlohmann::json_abi_v3_11_3::
                          basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                          ::operator[]<char_const>
                                    (in_stack_fffffffffffff3a0,in_stack_fffffffffffff398);
                          nlohmann::json_abi_v3_11_3::
                          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                          ::operator=((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                       *)CONCAT44(in_stack_fffffffffffff364,
                                                  in_stack_fffffffffffff360),
                                      (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                       *)in_stack_fffffffffffff358);
                          nlohmann::json_abi_v3_11_3::
                          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                          ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                         *)in_stack_fffffffffffff350);
                          nlohmann::json_abi_v3_11_3::
                          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                          ::
                          basic_json<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                                    ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                      *)in_stack_fffffffffffff370,in_stack_fffffffffffff368);
                          nlohmann::json_abi_v3_11_3::
                          basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                          ::operator[]<char_const>
                                    (in_stack_fffffffffffff3a0,in_stack_fffffffffffff398);
                          nlohmann::json_abi_v3_11_3::
                          basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                          ::operator[]<char_const>
                                    (in_stack_fffffffffffff3a0,in_stack_fffffffffffff398);
                          nlohmann::json_abi_v3_11_3::
                          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                          ::operator=((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                       *)CONCAT44(in_stack_fffffffffffff364,
                                                  in_stack_fffffffffffff360),
                                      (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                       *)in_stack_fffffffffffff358);
                          nlohmann::json_abi_v3_11_3::
                          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                          ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                         *)in_stack_fffffffffffff350);
                          local_5a4 = GlobalBrokerId::baseValue(&local_540->global_id);
                          nlohmann::json_abi_v3_11_3::
                          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                          ::basic_json<int,_int,_0>
                                    ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                      *)in_stack_fffffffffffff350,(int *)in_stack_fffffffffffff348);
                          nlohmann::json_abi_v3_11_3::
                          basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                          ::operator[]<char_const>
                                    (in_stack_fffffffffffff3a0,in_stack_fffffffffffff398);
                          nlohmann::json_abi_v3_11_3::
                          basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                          ::operator[]<char_const>
                                    (in_stack_fffffffffffff3a0,in_stack_fffffffffffff398);
                          nlohmann::json_abi_v3_11_3::
                          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                          ::operator=((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                       *)CONCAT44(in_stack_fffffffffffff364,
                                                  in_stack_fffffffffffff360),
                                      (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                       *)in_stack_fffffffffffff358);
                          nlohmann::json_abi_v3_11_3::
                          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                          ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                         *)in_stack_fffffffffffff350);
                          local_5bc = GlobalBrokerId::baseValue(&local_540->parent);
                          nlohmann::json_abi_v3_11_3::
                          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                          ::basic_json<int,_int,_0>
                                    ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                      *)in_stack_fffffffffffff350,(int *)in_stack_fffffffffffff348);
                          nlohmann::json_abi_v3_11_3::
                          basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                          ::operator[]<char_const>
                                    (in_stack_fffffffffffff3a0,in_stack_fffffffffffff398);
                          nlohmann::json_abi_v3_11_3::
                          basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                          ::operator[]<char_const>
                                    (in_stack_fffffffffffff3a0,in_stack_fffffffffffff398);
                          nlohmann::json_abi_v3_11_3::
                          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                          ::operator=((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                       *)CONCAT44(in_stack_fffffffffffff364,
                                                  in_stack_fffffffffffff360),
                                      (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                       *)in_stack_fffffffffffff358);
                          nlohmann::json_abi_v3_11_3::
                          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                          ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                         *)in_stack_fffffffffffff350);
                          if ((local_540->_core & 1U) == 0) {
                            nlohmann::json_abi_v3_11_3::
                            basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                            ::operator[]<char_const>
                                      (in_stack_fffffffffffff3a0,in_stack_fffffffffffff398);
                            nlohmann::json_abi_v3_11_3::
                            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                            ::push_back(in_stack_fffffffffffff3b0,
                                        (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                         *)in_stack_fffffffffffff3a8);
                          }
                          else {
                            nlohmann::json_abi_v3_11_3::
                            basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                            ::operator[]<char_const>
                                      (in_stack_fffffffffffff3a0,in_stack_fffffffffffff398);
                            nlohmann::json_abi_v3_11_3::
                            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                            ::push_back(in_stack_fffffffffffff3b0,
                                        (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                         *)in_stack_fffffffffffff3a8);
                          }
                          nlohmann::json_abi_v3_11_3::
                          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                          ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                         *)in_stack_fffffffffffff350);
                          __gnu_cxx::
                          __normal_iterator<const_helics::BasicBrokerInfo_*,_std::vector<helics::BasicBrokerInfo,_std::allocator<helics::BasicBrokerInfo>_>_>
                          ::operator++(&local_530);
                        }
                        fileops::generateJsonString
                                  ((json *)in_stack_fffffffffffff358,
                                   SUB81((ulong)in_stack_fffffffffffff350 >> 0x38,0));
                        local_104 = 1;
                        nlohmann::json_abi_v3_11_3::
                        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                        ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                       *)in_stack_fffffffffffff350);
                      }
                      else {
                        local_5e1._17_8_ = local_b8;
                        local_5c8 = pvStack_b0;
                        CLI::std::basic_string_view<char,_std::char_traits<char>_>::
                        basic_string_view((basic_string_view<char,_std::char_traits<char>_> *)
                                          CONCAT44(in_stack_fffffffffffff364,
                                                   in_stack_fffffffffffff360),
                                          (char *)in_stack_fffffffffffff358);
                        __x_09._M_str = (char *)in_stack_fffffffffffff380;
                        __x_09._M_len = (size_t)in_stack_fffffffffffff378;
                        __y_09._M_str = (char *)in_stack_fffffffffffff370;
                        __y_09._M_len = (size_t)in_stack_fffffffffffff368;
                        bVar1 = std::operator==(__x_09,__y_09);
                        if (bVar1) {
                          if (((in_RSI->super_BrokerBase).hasTimeDependency & 1U) == 0) {
                            std::allocator<char>::allocator();
                            std::__cxx11::string::string<std::allocator<char>>
                                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)in_stack_fffffffffffff390,
                                       (char *)CONCAT44(in_stack_fffffffffffff38c,
                                                        in_stack_fffffffffffff388),
                                       (allocator<char> *)in_stack_fffffffffffff380);
                            std::allocator<char>::~allocator(local_5e1);
                            local_104 = 1;
                          }
                          else {
                            pBVar6 = CLI::std::
                                     unique_ptr<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
                                     ::operator->((
                                                  unique_ptr<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
                                                  *)0x52c34f);
                            (*pBVar6->_vptr_BaseTimeCoordinator[0xb])(in_RDI);
                            local_104 = 1;
                          }
                        }
                        else {
                          local_5f8 = local_b8;
                          local_5f0 = pvStack_b0;
                          CLI::std::basic_string_view<char,_std::char_traits<char>_>::
                          basic_string_view((basic_string_view<char,_std::char_traits<char>_> *)
                                            CONCAT44(in_stack_fffffffffffff364,
                                                     in_stack_fffffffffffff360),
                                            (char *)in_stack_fffffffffffff358);
                          __x_10._M_str = (char *)in_stack_fffffffffffff380;
                          __x_10._M_len = (size_t)in_stack_fffffffffffff378;
                          __y_10._M_str = (char *)in_stack_fffffffffffff370;
                          __y_10._M_len = (size_t)in_stack_fffffffffffff368;
                          bVar1 = std::operator==(__x_10,__y_10);
                          if (bVar1) {
                            bVar1 = GlobalFederateId::isValid(&in_RSI->mTimeMonitorFederateId);
                            if (bVar1) {
                              local_618 = "{{\"time\":{}, \"federate\":{}}}";
                              local_610 = 0x1c;
                              local_620 = TimeRepresentation::operator_cast_to_double
                                                    ((TimeRepresentation<count_time<9,_long>_> *)
                                                     0x52c433);
                              local_48 = &in_RSI->mTimeMonitorFederate;
                              local_38 = local_618;
                              uStack_30 = local_610;
                              local_40 = &local_620;
                              local_58 = local_618;
                              uStack_50 = local_610;
                              local_18 = local_88;
                              local_20 = local_620;
                              local_88[0] = local_620;
                              ::fmt::v11::detail::value<fmt::v11::context>::
                              value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_0>
                                        ((value<fmt::v11::context> *)
                                         CONCAT44(in_stack_fffffffffffff364,
                                                  in_stack_fffffffffffff360),
                                         in_stack_fffffffffffff358);
                              local_8 = &local_68;
                              local_10 = local_88;
                              local_68 = 0xda;
                              fmt.size_ = in_stack_fffffffffffff5c8;
                              fmt.data_ = in_stack_fffffffffffff5c0;
                              args.field_1.values_ = in_stack_fffffffffffff5b8.values_;
                              args.desc_ = in_stack_fffffffffffff5b0;
                              local_60 = local_10;
                              ::fmt::v11::vformat_abi_cxx11_(fmt,args);
                              local_104 = 1;
                            }
                            else {
                              std::allocator<char>::allocator();
                              std::__cxx11::string::string<std::allocator<char>>
                                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)in_stack_fffffffffffff390,
                                         (char *)CONCAT44(in_stack_fffffffffffff38c,
                                                          in_stack_fffffffffffff388),
                                         (allocator<char> *)in_stack_fffffffffffff380);
                              std::allocator<char>::~allocator(&local_621);
                              local_104 = 1;
                            }
                          }
                          else {
                            local_638 = local_b8;
                            local_630 = pvStack_b0;
                            CLI::std::basic_string_view<char,_std::char_traits<char>_>::
                            basic_string_view((basic_string_view<char,_std::char_traits<char>_> *)
                                              CONCAT44(in_stack_fffffffffffff364,
                                                       in_stack_fffffffffffff360),
                                              (char *)in_stack_fffffffffffff358);
                            __x_11._M_str = (char *)in_stack_fffffffffffff380;
                            __x_11._M_len = (size_t)in_stack_fffffffffffff378;
                            __y_11._M_str = (char *)in_stack_fffffffffffff370;
                            __y_11._M_len = (size_t)in_stack_fffffffffffff368;
                            bVar1 = std::operator==(__x_11,__y_11);
                            if ((!bVar1) || (bVar1 = isConnected(in_stack_fffffffffffff350), bVar1))
                            {
                              iVar2 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::
                                      compare(in_stack_fffffffffffff380,
                                              (size_type)in_stack_fffffffffffff378,
                                              (size_type)in_stack_fffffffffffff370,
                                              (char *)in_stack_fffffffffffff368);
                              if (iVar2 == 0) {
                                local_690 = std::basic_string_view<char,_std::char_traits<char>_>::
                                            substr((basic_string_view<char,_std::char_traits<char>_>
                                                    *)in_stack_fffffffffffff370,
                                                   (size_type)in_stack_fffffffffffff368,
                                                   CONCAT44(in_stack_fffffffffffff364,
                                                            in_stack_fffffffffffff360));
                                name._M_len._4_2_ = in_stack_fffffffffffff3f4;
                                name._M_len._0_4_ = in_stack_fffffffffffff3f0;
                                name._M_len._6_1_ = in_stack_fffffffffffff3f6;
                                name._M_len._7_1_ = in_stack_fffffffffffff3f7;
                                name._M_str = in_stack_fffffffffffff3f8;
                                generateRename_abi_cxx11_
                                          ((CoreBroker *)
                                           CONCAT44(in_stack_fffffffffffff3ec,
                                                    in_stack_fffffffffffff3e8),name);
                                local_104 = 1;
                              }
                              else {
                                local_698._M_node =
                                     (_Base_ptr)
                                     std::
                                     map<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<unsigned_short,_helics::QueryReuse>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<unsigned_short,_helics::QueryReuse>_>_>_>
                                     ::find((map<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<unsigned_short,_helics::QueryReuse>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<unsigned_short,_helics::QueryReuse>_>_>_>
                                             *)in_stack_fffffffffffff348,(key_type *)0x52c8ec);
                                local_6a0._M_node =
                                     (_Base_ptr)
                                     std::
                                     map<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<unsigned_short,_helics::QueryReuse>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<unsigned_short,_helics::QueryReuse>_>_>_>
                                     ::end((map<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<unsigned_short,_helics::QueryReuse>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<unsigned_short,_helics::QueryReuse>_>_>_>
                                            *)in_stack_fffffffffffff348);
                                bVar1 = std::operator==(&local_698,&local_6a0);
                                if (((bVar1 ^ 0xffU) & 1) == 0) {
                                  local_70c._4_8_ = local_b8;
                                  pvStack_700 = pvStack_b0;
                                  this_04 = &in_RSI->handles;
                                  local_70c[0].gid = 0;
                                  GlobalFederateId::GlobalFederateId(local_70c);
                                  std::
                                  function<void(nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>&)>
                                  ::
                                  function<helics::CoreBroker::generateQueryAnswer(std::basic_string_view<char,std::char_traits<char>>,bool)::__0&,void>
                                            ((function<void_(nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_&)>
                                              *)CONCAT44(in_stack_fffffffffffff364,
                                                         in_stack_fffffffffffff360),
                                             (anon_class_8_1_8991fb9c *)in_stack_fffffffffffff358);
                                  generateInterfaceQueryResults
                                            (in_stack_fffffffffffff890,in_stack_fffffffffffff880,
                                             fed_00,in_stack_fffffffffffff878);
                                  std::
                                  function<void_(nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_&)>
                                  ::~function((function<void_(nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_&)>
                                               *)0x52cde3);
                                  bVar1 = CLI::std::__cxx11::
                                          basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          ::empty((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x52cdf0);
                                  if (bVar1) {
                                    CLI::std::basic_string_view<char,_std::char_traits<char>_>::
                                    basic_string_view((
                                                  basic_string_view<char,_std::char_traits<char>_> *
                                                  )CONCAT44(in_stack_fffffffffffff364,
                                                            in_stack_fffffffffffff360),
                                                  (char *)in_stack_fffffffffffff358);
                                    __x_12._M_str = (char *)in_stack_fffffffffffff380;
                                    __x_12._M_len = (size_t)in_stack_fffffffffffff378;
                                    __y_12._M_str = (char *)in_stack_fffffffffffff370;
                                    __y_12._M_len = (size_t)in_stack_fffffffffffff368;
                                    bVar1 = std::operator==(__x_12,__y_12);
                                    if (bVar1) {
                                      CLI::std::
                                      unique_ptr<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
                                      ::operator->((
                                                  unique_ptr<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
                                                  *)0x52ceb5);
                                      BaseTimeCoordinator::getDependencies
                                                (in_stack_fffffffffffff3a8);
                                      generateStringVector<std::vector<helics::GlobalFederateId,std::allocator<helics::GlobalFederateId>>,helics::CoreBroker::generateQueryAnswer[abi:cxx11](std::basic_string_view<char,std::char_traits<char>>,bool)::__7>
                                                (in_RDI,&stack0xfffffffffffff898);
                                      std::
                                      vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>
                                      ::~vector((vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>
                                                 *)CONCAT44(in_stack_fffffffffffff364,
                                                            in_stack_fffffffffffff360));
                                      local_104 = 1;
                                    }
                                    else {
                                      CLI::std::basic_string_view<char,_std::char_traits<char>_>::
                                      basic_string_view((
                                                  basic_string_view<char,_std::char_traits<char>_> *
                                                  )CONCAT44(in_stack_fffffffffffff364,
                                                            in_stack_fffffffffffff360),
                                                  (char *)in_stack_fffffffffffff358);
                                      __x_13._M_str = (char *)in_stack_fffffffffffff380;
                                      __x_13._M_len = (size_t)in_stack_fffffffffffff378;
                                      __y_13._M_str = (char *)in_stack_fffffffffffff370;
                                      __y_13._M_len = (size_t)in_stack_fffffffffffff368;
                                      bVar1 = std::operator==(__x_13,__y_13);
                                      if (bVar1) {
                                        CLI::std::
                                        unique_ptr<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
                                        ::operator->((
                                                  unique_ptr<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
                                                  *)0x52cfb0);
                                        BaseTimeCoordinator::getDependents
                                                  (in_stack_fffffffffffff3a8);
                                        generateStringVector<std::vector<helics::GlobalFederateId,std::allocator<helics::GlobalFederateId>>,helics::CoreBroker::generateQueryAnswer[abi:cxx11](std::basic_string_view<char,std::char_traits<char>>,bool)::__8>
                                                  (in_RDI,&local_7e0.sendMessageFunction.
                                                           super__Function_base._M_manager);
                                        std::
                                        vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>
                                        ::~vector((
                                                  vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>
                                                  *)CONCAT44(in_stack_fffffffffffff364,
                                                             in_stack_fffffffffffff360));
                                        local_104 = 1;
                                      }
                                      else {
                                        local_7e0.dependencies._24_8_ = local_b8;
                                        local_7e0.sendMessageFunction.super__Function_base.
                                        _M_functor._M_unused._M_object = pvStack_b0;
                                        CLI::std::basic_string_view<char,_std::char_traits<char>_>::
                                        basic_string_view((
                                                  basic_string_view<char,_std::char_traits<char>_> *
                                                  )CONCAT44(in_stack_fffffffffffff364,
                                                            in_stack_fffffffffffff360),
                                                  (char *)in_stack_fffffffffffff358);
                                        __x_14._M_str = (char *)in_stack_fffffffffffff380;
                                        __x_14._M_len = (size_t)in_stack_fffffffffffff378;
                                        __y_14._M_str = (char *)in_stack_fffffffffffff370;
                                        __y_14._M_len = (size_t)in_stack_fffffffffffff368;
                                        bVar1 = std::operator==(__x_14,__y_14);
                                        if (bVar1) {
                                          this_03 = &local_7e0;
                                          nlohmann::json_abi_v3_11_3::
                                          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                          ::basic_json((
                                                  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                                  *)in_stack_fffffffffffff350,
                                                  in_stack_fffffffffffff348);
                                          BrokerBase::addBaseInformation
                                                    (in_stack_fffffffffffff430,
                                                     in_stack_fffffffffffff428,(bool)hasParent);
                                          CLI::std::
                                          initializer_list<nlohmann::json_abi_v3_11_3::detail::json_ref<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
                                          ::initializer_list(&local_800);
                                          init_04._M_array._4_4_ = in_stack_fffffffffffff364;
                                          init_04._M_array._0_4_ = in_stack_fffffffffffff360;
                                          init_04._M_len = (size_type)in_stack_fffffffffffff368;
                                          nlohmann::json_abi_v3_11_3::
                                          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                          ::array(init_04);
                                          this_02 = nlohmann::json_abi_v3_11_3::
                                                                                                        
                                                  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                                                  ::operator[]<char_const>
                                                            (in_stack_fffffffffffff3a0,
                                                             in_stack_fffffffffffff398);
                                          key = local_7f0;
                                          nlohmann::json_abi_v3_11_3::
                                          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                          ::operator=((
                                                  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                                  *)CONCAT44(in_stack_fffffffffffff364,
                                                             in_stack_fffffffffffff360),
                                                  (
                                                  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                                  *)in_stack_fffffffffffff358);
                                          nlohmann::json_abi_v3_11_3::
                                          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                          ::~basic_json((
                                                  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                                  *)in_stack_fffffffffffff350);
                                          CLI::std::
                                          unique_ptr<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
                                          ::operator->((
                                                  unique_ptr<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
                                                  *)0x52d139);
                                          BaseTimeCoordinator::getDependents(this_03);
                                          local_808 = local_820;
                                          local_828._M_current =
                                               (GlobalFederateId *)
                                               std::
                                               vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>
                                               ::begin((
                                                  vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>
                                                  *)in_stack_fffffffffffff348);
                                          local_830 = (GlobalFederateId *)
                                                      std::
                                                  vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>
                                                  ::end((
                                                  vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>
                                                  *)in_stack_fffffffffffff348);
                                          while (bVar1 = __gnu_cxx::
                                                                                                                  
                                                  operator==<helics::GlobalFederateId_*,_std::vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>_>
                                                            ((
                                                  __normal_iterator<helics::GlobalFederateId_*,_std::vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>_>
                                                  *)in_stack_fffffffffffff350,
                                                  (
                                                  __normal_iterator<helics::GlobalFederateId_*,_std::vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>_>
                                                  *)in_stack_fffffffffffff348),
                                                ((bVar1 ^ 0xffU) & 1) != 0) {
                                            local_838 = __gnu_cxx::
                                                                                                                
                                                  __normal_iterator<helics::GlobalFederateId_*,_std::vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>_>
                                                  ::operator*(&local_828);
                                            nlohmann::json_abi_v3_11_3::
                                            basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                                            ::operator[]<char_const>(this_02,key);
                                            local_84c = GlobalFederateId::baseValue(local_838);
                                            nlohmann::json_abi_v3_11_3::
                                            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                            ::basic_json<int,_int,_0>
                                                      ((
                                                  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                                  *)in_stack_fffffffffffff350,
                                                  (int *)in_stack_fffffffffffff348);
                                            nlohmann::json_abi_v3_11_3::
                                            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                            ::push_back((
                                                  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                                  *)this_04,
                                                  (
                                                  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                                  *)this_03);
                                            nlohmann::json_abi_v3_11_3::
                                            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                            ::~basic_json((
                                                  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                                  *)in_stack_fffffffffffff350);
                                            __gnu_cxx::
                                            __normal_iterator<helics::GlobalFederateId_*,_std::vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>_>
                                            ::operator++(&local_828);
                                          }
                                          local_104 = 6;
                                          std::
                                          vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>
                                          ::~vector((
                                                  vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>
                                                  *)CONCAT44(in_stack_fffffffffffff364,
                                                             in_stack_fffffffffffff360));
                                          CLI::std::
                                          initializer_list<nlohmann::json_abi_v3_11_3::detail::json_ref<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
                                          ::initializer_list(local_870);
                                          init_05._M_array._4_4_ = in_stack_fffffffffffff364;
                                          init_05._M_array._0_4_ = in_stack_fffffffffffff360;
                                          init_05._M_len = (size_type)in_stack_fffffffffffff368;
                                          nlohmann::json_abi_v3_11_3::
                                          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                          ::array(init_05);
                                          nlohmann::json_abi_v3_11_3::
                                          basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                                          ::operator[]<char_const>(this_02,key);
                                          nlohmann::json_abi_v3_11_3::
                                          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                          ::operator=((
                                                  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                                  *)CONCAT44(in_stack_fffffffffffff364,
                                                             in_stack_fffffffffffff360),
                                                  (
                                                  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                                  *)in_stack_fffffffffffff358);
                                          nlohmann::json_abi_v3_11_3::
                                          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                          ::~basic_json((
                                                  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                                  *)in_stack_fffffffffffff350);
                                          CLI::std::
                                          unique_ptr<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
                                          ::operator->((
                                                  unique_ptr<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
                                                  *)0x52d359);
                                          BaseTimeCoordinator::getDependencies(this_03);
                                          local_878 = local_890;
                                          local_898._M_current =
                                               (GlobalFederateId *)
                                               std::
                                               vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>
                                               ::begin((
                                                  vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>
                                                  *)in_stack_fffffffffffff348);
                                          local_8a0 = (GlobalFederateId *)
                                                      std::
                                                  vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>
                                                  ::end((
                                                  vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>
                                                  *)in_stack_fffffffffffff348);
                                          while (bVar1 = __gnu_cxx::
                                                                                                                  
                                                  operator==<helics::GlobalFederateId_*,_std::vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>_>
                                                            ((
                                                  __normal_iterator<helics::GlobalFederateId_*,_std::vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>_>
                                                  *)in_stack_fffffffffffff350,
                                                  (
                                                  __normal_iterator<helics::GlobalFederateId_*,_std::vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>_>
                                                  *)in_stack_fffffffffffff348),
                                                ((bVar1 ^ 0xffU) & 1) != 0) {
                                            local_8a8 = __gnu_cxx::
                                                                                                                
                                                  __normal_iterator<helics::GlobalFederateId_*,_std::vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>_>
                                                  ::operator*(&local_898);
                                            nlohmann::json_abi_v3_11_3::
                                            basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                                            ::operator[]<char_const>(this_02,key);
                                            in_stack_fffffffffffff364 =
                                                 GlobalFederateId::baseValue(local_8a8);
                                            in_stack_fffffffffffff358 =
                                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)(local_8e1 + 0x29);
                                            local_8e1._37_4_ = in_stack_fffffffffffff364;
                                            nlohmann::json_abi_v3_11_3::
                                            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                            ::basic_json<int,_int,_0>
                                                      ((
                                                  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                                  *)in_stack_fffffffffffff350,
                                                  (int *)in_stack_fffffffffffff348);
                                            nlohmann::json_abi_v3_11_3::
                                            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                            ::push_back((
                                                  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                                  *)this_04,
                                                  (
                                                  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                                  *)this_03);
                                            nlohmann::json_abi_v3_11_3::
                                            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                            ::~basic_json((
                                                  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                                  *)in_stack_fffffffffffff350);
                                            __gnu_cxx::
                                            __normal_iterator<helics::GlobalFederateId_*,_std::vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>_>
                                            ::operator++(&local_898);
                                          }
                                          local_104 = 8;
                                          std::
                                          vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>
                                          ::~vector((
                                                  vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>
                                                  *)CONCAT44(in_stack_fffffffffffff364,
                                                             in_stack_fffffffffffff360));
                                          fileops::generateJsonString
                                                    ((json *)in_stack_fffffffffffff358,
                                                     SUB81((ulong)in_stack_fffffffffffff350 >> 0x38,
                                                           0));
                                          local_104 = 1;
                                          nlohmann::json_abi_v3_11_3::
                                          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                          ::~basic_json((
                                                  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                                  *)in_stack_fffffffffffff350);
                                        }
                                        else {
                                          in_stack_fffffffffffff350 = (CoreBroker *)local_8e1;
                                          std::allocator<char>::allocator();
                                          code = (JsonErrorCodes)((ulong)this_04 >> 0x20);
                                          std::__cxx11::string::string<std::allocator<char>>
                                                    ((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)in_stack_fffffffffffff390,
                                                  (char *)CONCAT44(in_stack_fffffffffffff38c,
                                                                   in_stack_fffffffffffff388),
                                                  (allocator<char> *)in_stack_fffffffffffff380);
                                          generateJsonErrorResponse
                                                    (code,(string *)in_stack_fffffffffffff3a8);
                                          std::__cxx11::string::~string
                                                    ((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)in_stack_fffffffffffff350);
                                          std::allocator<char>::~allocator
                                                    ((allocator<char> *)local_8e1);
                                          local_104 = 1;
                                        }
                                      }
                                    }
                                  }
                                  else {
                                    std::__cxx11::string::string
                                              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                *)in_stack_fffffffffffff390,
                                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                *)CONCAT44(in_stack_fffffffffffff38c,
                                                           in_stack_fffffffffffff388));
                                    local_104 = 1;
                                  }
                                  std::__cxx11::string::~string
                                            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                              *)in_stack_fffffffffffff350);
                                }
                                else {
                                  ppVar7 = std::
                                           _Rb_tree_const_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<unsigned_short,_helics::QueryReuse>_>_>
                                           ::operator->((
                                                  _Rb_tree_const_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<unsigned_short,_helics::QueryReuse>_>_>
                                                  *)0x52c947);
                                  local_6a2 = (ppVar7->second).first;
                                  bVar1 = isValidIndex<unsigned_short,std::vector<std::tuple<helics::fileops::JsonMapBuilder,std::vector<helics::ActionMessage,std::allocator<helics::ActionMessage>>,helics::QueryReuse>,std::allocator<std::tuple<helics::fileops::JsonMapBuilder,std::vector<helics::ActionMessage,std::allocator<helics::ActionMessage>>,helics::QueryReuse>>>>
                                                    ((unsigned_short)
                                                     ((ulong)in_stack_fffffffffffff350 >> 0x30),
                                                     (
                                                  vector<std::tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>,_std::allocator<std::tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>_>_>
                                                  *)in_stack_fffffffffffff348);
                                  if ((bVar1) &&
                                     (ppVar7 = std::
                                               _Rb_tree_const_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<unsigned_short,_helics::QueryReuse>_>_>
                                               ::operator->((
                                                  _Rb_tree_const_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<unsigned_short,_helics::QueryReuse>_>_>
                                                  *)0x52c995), (ppVar7->second).second == ENABLED))
                                  {
                                    std::
                                    vector<std::tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>,_std::allocator<std::tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>_>_>
                                    ::operator[]((vector<std::tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>,_std::allocator<std::tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>_>_>
                                                  *)&in_RSI->mapBuilders,(ulong)local_6a2);
                                    local_6b0 = std::
                                                get<0ul,helics::fileops::JsonMapBuilder,std::vector<helics::ActionMessage,std::allocator<helics::ActionMessage>>,helics::QueryReuse>
                                                          ((
                                                  tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>
                                                  *)0x52c9c5);
                                    bVar1 = fileops::JsonMapBuilder::isCompleted
                                                      ((JsonMapBuilder *)in_stack_fffffffffffff350);
                                    if (bVar1) {
                                      iVar2 = generateMapObjectCounter(in_stack_fffffffffffff390);
                                      local_6b4 = iVar2;
                                      iVar3 = fileops::JsonMapBuilder::getCounterCode(local_6b0);
                                      if (iVar2 == iVar3) {
                                        fileops::JsonMapBuilder::generate_abi_cxx11_
                                                  (in_stack_fffffffffffff378);
                                        local_104 = 1;
                                        goto LAB_0052d600;
                                      }
                                      fileops::JsonMapBuilder::reset
                                                ((JsonMapBuilder *)in_stack_fffffffffffff350);
                                    }
                                    bVar1 = fileops::JsonMapBuilder::isActive
                                                      ((JsonMapBuilder *)0x52ca92);
                                    if (bVar1) {
                                      std::allocator<char>::allocator();
                                      std::__cxx11::string::string<std::allocator<char>>
                                                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)in_stack_fffffffffffff390,
                                                 (char *)CONCAT44(in_stack_fffffffffffff38c,
                                                                  in_stack_fffffffffffff388),
                                                 (allocator<char> *)in_stack_fffffffffffff380);
                                      std::allocator<char>::~allocator(&local_6b5);
                                      local_104 = 1;
                                      goto LAB_0052d600;
                                    }
                                  }
                                  local_6c8 = local_b8;
                                  pvStack_6c0 = pvStack_b0;
                                  std::
                                  _Rb_tree_const_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<unsigned_short,_helics::QueryReuse>_>_>
                                  ::operator->((_Rb_tree_const_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<unsigned_short,_helics::QueryReuse>_>_>
                                                *)0x52cb4c);
                                  request_01._M_str._7_1_ = in_stack_fffffffffffffbe7;
                                  request_01._0_15_ = in_stack_fffffffffffffbd8;
                                  initializeMapBuilder
                                            (in_stack_fffffffffffffbd0,request_01,
                                             in_stack_fffffffffffffbce,in_stack_fffffffffffffbcd,
                                             (bool)in_stack_fffffffffffffbcc);
                                  std::
                                  vector<std::tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>,_std::allocator<std::tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>_>_>
                                  ::operator[]((vector<std::tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>,_std::allocator<std::tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>_>_>
                                                *)&in_RSI->mapBuilders,(ulong)local_6a2);
                                  std::
                                  get<0ul,helics::fileops::JsonMapBuilder,std::vector<helics::ActionMessage,std::allocator<helics::ActionMessage>>,helics::QueryReuse>
                                            ((tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>
                                              *)0x52cbaa);
                                  bVar1 = fileops::JsonMapBuilder::isCompleted
                                                    ((JsonMapBuilder *)in_stack_fffffffffffff350);
                                  if (bVar1) {
                                    ppVar7 = std::
                                             _Rb_tree_const_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<unsigned_short,_helics::QueryReuse>_>_>
                                             ::operator->((
                                                  _Rb_tree_const_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<unsigned_short,_helics::QueryReuse>_>_>
                                                  *)0x52cbd8);
                                    if ((ppVar7->second).second == ENABLED) {
                                      local_6cc = generateMapObjectCounter
                                                            (in_stack_fffffffffffff390);
                                      std::
                                      vector<std::tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>,_std::allocator<std::tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>_>_>
                                      ::operator[]((
                                                  vector<std::tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>,_std::allocator<std::tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>_>_>
                                                  *)&in_RSI->mapBuilders,(ulong)local_6a2);
                                      this_01 = std::
                                                get<0ul,helics::fileops::JsonMapBuilder,std::vector<helics::ActionMessage,std::allocator<helics::ActionMessage>>,helics::QueryReuse>
                                                          ((
                                                  tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>
                                                  *)0x52cc28);
                                      fileops::JsonMapBuilder::setCounterCode(this_01,local_6cc);
                                    }
                                    if (local_6a2 == 9) {
                                      std::
                                      vector<std::tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>,_std::allocator<std::tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>_>_>
                                      ::operator[]((
                                                  vector<std::tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>,_std::allocator<std::tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>_>_>
                                                  *)&in_RSI->mapBuilders,9);
                                      std::
                                      get<0ul,helics::fileops::JsonMapBuilder,std::vector<helics::ActionMessage,std::allocator<helics::ActionMessage>>,helics::QueryReuse>
                                                ((tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>
                                                  *)0x52cc6e);
                                      generateGlobalStatus_abi_cxx11_
                                                (in_stack_fffffffffffff678,
                                                 (JsonMapBuilder *)
                                                 CONCAT44(in_stack_fffffffffffff674,
                                                          in_stack_fffffffffffff670));
                                      local_104 = 1;
                                    }
                                    else {
                                      std::
                                      vector<std::tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>,_std::allocator<std::tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>_>_>
                                      ::operator[]((
                                                  vector<std::tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>,_std::allocator<std::tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>_>_>
                                                  *)&in_RSI->mapBuilders,(ulong)local_6a2);
                                      std::
                                      get<0ul,helics::fileops::JsonMapBuilder,std::vector<helics::ActionMessage,std::allocator<helics::ActionMessage>>,helics::QueryReuse>
                                                ((tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>
                                                  *)0x52ccbe);
                                      fileops::JsonMapBuilder::generate_abi_cxx11_
                                                (in_stack_fffffffffffff378);
                                      local_104 = 1;
                                    }
                                  }
                                  else {
                                    std::allocator<char>::allocator();
                                    std::__cxx11::string::string<std::allocator<char>>
                                              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                *)in_stack_fffffffffffff390,
                                               (char *)CONCAT44(in_stack_fffffffffffff38c,
                                                                in_stack_fffffffffffff388),
                                               (allocator<char> *)in_stack_fffffffffffff380);
                                    std::allocator<char>::~allocator(&local_6cd);
                                    local_104 = 1;
                                  }
                                }
                              }
                            }
                            else {
                              nlohmann::json_abi_v3_11_3::
                              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                              ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                            *)in_stack_fffffffffffff350,in_stack_fffffffffffff348);
                              BrokerBase::addBaseInformation
                                        (in_stack_fffffffffffff430,in_stack_fffffffffffff428,
                                         (bool)hasParent);
                              nlohmann::json_abi_v3_11_3::
                              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                              ::basic_json<const_char_(&)[13],_char[13],_0>
                                        ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                          *)in_stack_fffffffffffff370,
                                         (char (*) [13])in_stack_fffffffffffff368);
                              nlohmann::json_abi_v3_11_3::
                              basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                              ::operator[]<char_const>
                                        (in_stack_fffffffffffff3a0,in_stack_fffffffffffff398);
                              nlohmann::json_abi_v3_11_3::
                              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                              ::operator=((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                           *)CONCAT44(in_stack_fffffffffffff364,
                                                      in_stack_fffffffffffff360),
                                          (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                           *)in_stack_fffffffffffff358);
                              nlohmann::json_abi_v3_11_3::
                              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                              ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                             *)in_stack_fffffffffffff350);
                              local_67c = 0xffffffff;
                              nlohmann::json_abi_v3_11_3::
                              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                              ::basic_json<int,_int,_0>
                                        ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                          *)in_stack_fffffffffffff350,
                                         (int *)in_stack_fffffffffffff348);
                              nlohmann::json_abi_v3_11_3::
                              basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                              ::operator[]<char_const>
                                        (in_stack_fffffffffffff3a0,in_stack_fffffffffffff398);
                              nlohmann::json_abi_v3_11_3::
                              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                              ::operator=((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                           *)CONCAT44(in_stack_fffffffffffff364,
                                                      in_stack_fffffffffffff360),
                                          (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                           *)in_stack_fffffffffffff358);
                              nlohmann::json_abi_v3_11_3::
                              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                              ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                             *)in_stack_fffffffffffff350);
                              fileops::generateJsonString
                                        ((json *)in_stack_fffffffffffff358,
                                         SUB81((ulong)in_stack_fffffffffffff350 >> 0x38,0));
                              local_104 = 1;
                              nlohmann::json_abi_v3_11_3::
                              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                              ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                             *)in_stack_fffffffffffff350);
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  else {
    std::__cxx11::string::string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff390,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffff38c,in_stack_fffffffffffff388));
    local_104 = 1;
  }
LAB_0052d600:
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff350);
  return in_RDI;
}

Assistant:

std::string CoreBroker::generateQueryAnswer(std::string_view request, bool force_ordering)
{
    auto addHeader = [this](nlohmann::json& base) { addBaseInformation(base, !isRootc); };

    auto res = quickBrokerQueries(request);
    if (!res.empty()) {
        return res;
    }
    if (request == "counts") {
        nlohmann::json base;
        addHeader(base);
        base["brokers"] = static_cast<int>(mBrokers.size());
        base["federates"] = static_cast<int>(mFederates.size());
        base["countable_federates"] = getCountableFederates();
        base["interfaces"] = static_cast<int>(handles.size());
        return fileops::generateJsonString(base);
    }
    if (request == "summary") {
        return generateFederationSummary();
    }
    if (request == "config") {
        nlohmann::json base;
        base["name"] = getIdentifier();
        if (uuid_like) {
            base["uuid"] = getIdentifier();
        }
        if (!isRootc) {
            base["parent"] = higher_broker_id.baseValue();
        }
        base["id"] = global_broker_id_local.baseValue();
        base["log_level"] = logLevelToString(static_cast<LogLevels>(maxLogLevel.load()));
        base["root"] = isRoot();
        return fileops::generateJsonString(base);
    }
    if (request == "monitor") {
        return std::string{"\""} + mTimeMonitorFederate + '"';
    }
    if (request == "logs") {
        nlohmann::json base;
        addBaseInformation(base, !isRootc);
        bufferToJson(mLogManager->getLogBuffer(), base);
        return fileops::generateJsonString(base);
    }
    if (request == "federates") {
        return generateStringVector(mFederates, [](auto& fed) { return fed.name; });
    }
    if (request == "brokers") {
        return generateStringVector(mBrokers, [](auto& brk) { return brk.name; });
    }
    if (request == "subbrokers") {
        return generateStringVector_if(
            mBrokers, [](auto& brk) { return brk.name; }, [](auto& brk) { return !brk._core; });
    }
    if (request == "cores") {
        return generateStringVector_if(
            mBrokers, [](auto& brk) { return brk.name; }, [](auto& brk) { return brk._core; });
    }
    if (request == "current_state") {
        nlohmann::json base;
        addBaseInformation(base, !isRootc);
        base["state"] = brokerStateName(getBrokerState());
        base["status"] = isConnected();
        base["federates"] = nlohmann::json::array();
        for (const auto& fed : mFederates) {
            nlohmann::json fedstate;
            fedstate["attributes"] = nlohmann::json::object();
            fedstate["attributes"]["name"] = fed.name;
            fedstate["state"] = stateString(fed.state);
            fedstate["attributes"]["id"] = fed.global_id.baseValue();
            fedstate["attributes"]["parent"] = fed.parent.baseValue();
            base["federates"].push_back(std::move(fedstate));
        }
        base["cores"] = nlohmann::json::array();
        base["brokers"] = nlohmann::json::array();
        for (const auto& brk : mBrokers) {
            nlohmann::json brkstate;
            brkstate["state"] = stateString(brk.state);
            brkstate["attributes"] = nlohmann::json::object();
            brkstate["attributes"]["name"] = brk.name;
            brkstate["attributes"]["id"] = brk.global_id.baseValue();
            brkstate["attributes"]["parent"] = brk.parent.baseValue();
            if (brk._core) {
                base["cores"].push_back(std::move(brkstate));
            } else {
                base["brokers"].push_back(std::move(brkstate));
            }
        }
        return fileops::generateJsonString(base);
    }
    if (request == "current_time") {
        if (!hasTimeDependency) {
            return "{}";
        }
        return timeCoord->printTimeStatus();
    }
    if (request == "time_monitor") {
        if (mTimeMonitorFederateId.isValid()) {
            return fmt::format(R"raw({{"time":{}, "federate":{}}})raw",
                               static_cast<double>(mTimeMonitorCurrentTime),
                               mTimeMonitorFederate);
        }
        return "{}";
    }
    if (request == "global_status") {
        if (!isConnected()) {
            nlohmann::json json;
            addBaseInformation(json, !isRootc);
            json["status"] = "disconnected";
            json["timestep"] = -1;
            return fileops::generateJsonString(json);
        }
    }
    if (request.compare(0, 7, "rename:") == 0) {
        return generateRename(request.substr(7));
    }
    auto mapping = mapIndex.find(request);
    if (mapping != mapIndex.end()) {
        auto index = mapping->second.first;
        if (isValidIndex(index, mapBuilders) && mapping->second.second == QueryReuse::ENABLED) {
            auto& builder = std::get<0>(mapBuilders[index]);
            if (builder.isCompleted()) {
                auto center = generateMapObjectCounter();
                if (center == builder.getCounterCode()) {
                    return builder.generate();
                }
                builder.reset();
            }
            if (builder.isActive()) {
                return "#wait";
            }
        }

        initializeMapBuilder(request, index, mapping->second.second, force_ordering);
        if (std::get<0>(mapBuilders[index]).isCompleted()) {
            if (mapping->second.second == QueryReuse::ENABLED) {
                auto center = generateMapObjectCounter();
                std::get<0>(mapBuilders[index]).setCounterCode(center);
            }
            if (index == GLOBAL_STATUS) {
                return generateGlobalStatus(std::get<0>(mapBuilders[index]));
            }
            return std::get<0>(mapBuilders[index]).generate();
        }
        return "#wait";
    }
    auto interfaceQueryResult =
        generateInterfaceQueryResults(request, handles, GlobalFederateId{}, addHeader);
    if (!interfaceQueryResult.empty()) {
        return interfaceQueryResult;
    }
    if (request == "dependson") {
        return generateStringVector(timeCoord->getDependencies(), [](const auto& dep) {
            return std::to_string(dep.baseValue());
        });
    }
    if (request == "dependents") {
        return generateStringVector(timeCoord->getDependents(), [](const auto& dep) {
            return std::to_string(dep.baseValue());
        });
    }
    if (request == "dependencies") {
        nlohmann::json base;
        addBaseInformation(base, !isRootc);
        base["dependents"] = nlohmann::json::array();
        for (const auto& dep : timeCoord->getDependents()) {
            base["dependents"].push_back(dep.baseValue());
        }
        base["dependencies"] = nlohmann::json::array();
        for (const auto& dep : timeCoord->getDependencies()) {
            base["dependencies"].push_back(dep.baseValue());
        }
        return fileops::generateJsonString(base);
    }
    return generateJsonErrorResponse(JsonErrorCodes::BAD_REQUEST, "unrecognized broker query");
}